

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O3

bool remote::FindProcessByName(string *name,Handle *out)

{
  char *__s;
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  bool bVar8;
  string procPath;
  string mapsPath;
  Handle proc;
  string exeName;
  string local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_> *local_d0;
  string *local_c8;
  string *local_c0;
  Handle local_b8;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (((out != (Handle *)0x0) && (name->_M_string_length != 0)) &&
     (__dirp = opendir("/proc/"), __dirp != (DIR *)0x0)) {
    local_c0 = name;
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      local_c8 = (string *)&out->pidStr;
      local_d0 = &out->regions;
      do {
        if (pdVar3->d_type == '\x04') {
          __s = pdVar3->d_name;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          sVar4 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,__s,pdVar3->d_name + sVar4);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x10800f);
          plVar7 = plVar5 + 2;
          if ((string *)*plVar5 == (string *)plVar7) {
            local_b8.pidStr._M_dataplus._M_p = (pointer)*plVar7;
            local_b8.pidStr._M_string_length = plVar5[3];
            local_b8.addressOfClientModule = (unsigned_long)&local_b8.pidStr;
          }
          else {
            local_b8.pidStr._M_dataplus._M_p = (pointer)*plVar7;
            local_b8.addressOfClientModule = (unsigned_long)*plVar5;
          }
          local_b8._8_8_ = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_f0 = &local_e0;
          plVar7 = plVar5 + 2;
          if ((long *)*plVar5 == plVar7) {
            local_e0 = *plVar7;
            lStack_d8 = plVar5[3];
          }
          else {
            local_e0 = *plVar7;
            local_f0 = (long *)*plVar5;
          }
          local_e8 = plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if ((string *)local_b8.addressOfClientModule != &local_b8.pidStr) {
            operator_delete((void *)local_b8.addressOfClientModule);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          iVar2 = access((char *)local_f0,0);
          if (iVar2 == -1) {
            bVar8 = false;
          }
          else {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            sVar4 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar4);
            Handle::Handle(&local_b8,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            bVar8 = false;
            if ((local_b8.pid != -1) && (bVar1 = Handle::IsRunning(&local_b8), bVar1)) {
              Handle::GetPath_abi_cxx11_(&local_110,&local_b8);
              bVar8 = false;
              if ((local_110._M_string_length != 0) &&
                 (lVar6 = std::__cxx11::string::rfind((char)&local_110,0x2f), lVar6 != -1)) {
                std::__cxx11::string::substr((ulong)local_50,(ulong)&local_110);
                iVar2 = std::__cxx11::string::compare((string *)local_50);
                bVar8 = iVar2 == 0;
                if (bVar8) {
                  out->pid = local_b8.pid;
                  out->addressOfClientModule = local_b8.addressOfClientModule;
                  std::__cxx11::string::_M_assign(local_c8);
                  std::
                  vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                  ::operator=(local_d0,&local_b8.regions);
                }
                if (local_50[0] != local_40) {
                  operator_delete(local_50[0]);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p);
              }
            }
            std::
            vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
            ~vector(&local_b8.regions);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8.pidStr._M_dataplus._M_p != &local_b8.pidStr.field_2) {
              operator_delete(local_b8.pidStr._M_dataplus._M_p);
            }
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0);
          }
          if (bVar8) {
            return true;
          }
        }
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  return false;
}

Assistant:

bool remote::FindProcessByName(std::string name, remote::Handle* out) {
    if(out == NULL || name.empty())
        return false;

    struct dirent *dire;

    DIR *dir = opendir("/proc/");

    if (dir) {
        while ((dire = readdir(dir)) != NULL) {
            if (dire->d_type != DT_DIR)
                continue;

            std::string mapsPath = ("/proc/" + std::string(dire->d_name) + "/maps");

            if (access(mapsPath.c_str(), F_OK) == -1)
                continue;

            remote::Handle proc(dire->d_name);

            if (!proc.IsValid() || !proc.IsRunning())
                continue;

            std::string procPath = proc.GetPath();

            if(procPath.empty())
                continue;

            size_t namePos = procPath.find_last_of('/');

            if(namePos == -1)
                continue; // what?

            std::string exeName = procPath.substr(namePos + 1);

            if(exeName.compare(name) == 0) {
                *out = proc;

                return true;
            }
        }

        closedir(dir);
    }

    return false;
}